

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.cpp
# Opt level: O1

Vec3<double> * Imath_2_5::rgb2hsv_d(Vec3<double> *c)

{
  double dVar1;
  double dVar2;
  Vec3<double> *in_RDI;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = c->x;
  dVar2 = c->y;
  dVar6 = c->z;
  dVar3 = dVar1;
  if (dVar1 <= dVar2) {
    dVar3 = dVar2;
  }
  if (dVar3 <= dVar6) {
    dVar3 = dVar6;
  }
  dVar5 = dVar1;
  if (dVar2 <= dVar1) {
    dVar5 = dVar2;
  }
  if (dVar6 <= dVar5) {
    dVar5 = dVar6;
  }
  dVar5 = dVar3 - dVar5;
  dVar6 = 0.0;
  dVar4 = (double)(-(ulong)(dVar3 != 0.0) & (ulong)(dVar5 / dVar3));
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    if ((dVar1 != dVar3) || (NAN(dVar1) || NAN(dVar3))) {
      if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) {
        dVar5 = (dVar1 - dVar2) / dVar5 + 4.0;
      }
      else {
        dVar5 = (c->z - dVar1) / dVar5 + 2.0;
      }
    }
    else {
      dVar5 = (dVar2 - c->z) / dVar5;
    }
    dVar5 = dVar5 / 6.0;
    dVar6 = (double)(~-(ulong)(dVar5 < 0.0) & (ulong)dVar5 |
                    (ulong)(dVar5 + 1.0) & -(ulong)(dVar5 < 0.0));
  }
  in_RDI->x = dVar6;
  in_RDI->y = dVar4;
  in_RDI->z = dVar3;
  return in_RDI;
}

Assistant:

Vec3<double>
rgb2hsv_d(const Vec3<double> &c)
{
    const double &x = c.x;
    const double &y = c.y;
    const double &z = c.z;

    double max	 = (x > y) ? ((x > z) ? x : z) : ((y > z) ? y : z);
    double min	 = (x < y) ? ((x < z) ? x : z) : ((y < z) ? y : z);
    double range = max - min;
    double val	 = max;
    double sat   = 0;
    double hue   = 0;
    
    if (max != 0)   sat = range/max;
    
    if (sat != 0) 
    {
	double h;
	
	if      (x == max)	h =     (y - z) / range;
	else if (y == max)	h = 2 + (z - x) / range;
	else		h = 4 + (x - y) / range;

	hue = h/6.;
	    
	if (hue < 0.)
	    hue += 1.0;
    }
    return Vec3<double>(hue,sat,val);
}